

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.cc
# Opt level: O3

void __thiscall
rcg::GenTLException::GenTLException
          (GenTLException *this,string *msg,shared_ptr<const_rcg::GenTLWrapper> *gentl)

{
  size_type sVar1;
  ostream *poVar2;
  size_t sVar3;
  GC_ERROR err;
  size_t tmp_size;
  ostringstream out;
  char tmp [1024];
  int local_5dc;
  size_t local_5d8;
  undefined1 *local_5d0 [2];
  undefined1 local_5c0 [16];
  ostringstream local_5b0 [112];
  ios_base local_540 [264];
  char local_438 [1032];
  
  *(undefined ***)this = &PTR__GenTLException_0012ec58;
  (this->s)._M_dataplus._M_p = (pointer)&(this->s).field_2;
  (this->s)._M_string_length = 0;
  (this->s).field_2._M_local_buf[0] = '\0';
  memset(local_438,0,0x400);
  local_5d8 = 0x400;
  (*((gentl->super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    GCGetLastError)(&local_5dc,local_438,&local_5d8);
  std::__cxx11::ostringstream::ostringstream(local_5b0);
  sVar1 = msg->_M_string_length;
  if ((sVar1 == 0) || (local_5dc == 0)) {
    if (sVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_5b0,(msg->_M_dataplus)._M_p,sVar1);
      goto LAB_00121b5d;
    }
    sVar3 = strlen(local_438);
    poVar2 = (ostream *)local_5b0;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_438,sVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," (",2);
  }
  else {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_5b0,(msg->_M_dataplus)._M_p,sVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
    sVar3 = strlen(local_438);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_438,sVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," (",2);
  }
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,local_5dc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
LAB_00121b5d:
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->s,(string *)local_5d0);
  if (local_5d0[0] != local_5c0) {
    operator_delete(local_5d0[0]);
  }
  std::__cxx11::ostringstream::~ostringstream(local_5b0);
  std::ios_base::~ios_base(local_540);
  return;
}

Assistant:

GenTLException::GenTLException(const std::string &msg,
                               const std::shared_ptr<const GenTLWrapper> &gentl)
{
  GenTL::GC_ERROR err;
  char tmp[1024]="";
  size_t tmp_size=sizeof(tmp);

  gentl->GCGetLastError(&err, tmp, &tmp_size);

  std::ostringstream out;

  if (msg.size() > 0 && err != GenTL::GC_ERR_SUCCESS)
  {
    out << msg << ": " << tmp << " (" << err << ")";
  }
  else if (msg.size() > 0)
  {
    out << msg;
  }
  else
  {
    out << tmp << " (" << err << ")";
  }

  s=out.str();
}